

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

PerformanceStats * __thiscall
Jinx::Impl::Runtime::GetScriptPerformanceStats
          (PerformanceStats *__return_storage_ptr__,Runtime *this,bool resetStats)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  undefined3 in_register_00000011;
  
  std::mutex::lock(&this->m_perfMutex);
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->m_perfStats).perfTimeNs = lVar4 - (this->m_perfStartTime).__d.__r;
  __return_storage_ptr__->instructionCount = (this->m_perfStats).instructionCount;
  uVar1 = (this->m_perfStats).compilationTimeNs;
  uVar2 = (this->m_perfStats).executionTimeNs;
  uVar3 = (this->m_perfStats).scriptCompletionCount;
  __return_storage_ptr__->scriptExecutionCount = (this->m_perfStats).scriptExecutionCount;
  __return_storage_ptr__->scriptCompletionCount = uVar3;
  __return_storage_ptr__->compilationTimeNs = uVar1;
  __return_storage_ptr__->executionTimeNs = uVar2;
  __return_storage_ptr__->perfTimeNs = (this->m_perfStats).perfTimeNs;
  __return_storage_ptr__->scriptCompilationCount = (this->m_perfStats).scriptCompilationCount;
  if (CONCAT31(in_register_00000011,resetStats) != 0) {
    (this->m_perfStats).scriptExecutionCount = 0;
    (this->m_perfStats).scriptCompletionCount = 0;
    (this->m_perfStats).perfTimeNs = 0;
    (this->m_perfStats).scriptCompilationCount = 0;
    (this->m_perfStats).compilationTimeNs = 0;
    (this->m_perfStats).executionTimeNs = 0;
    (this->m_perfStats).instructionCount = 0;
    (this->m_perfStartTime).__d.__r = lVar4;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_perfMutex);
  return __return_storage_ptr__;
}

Assistant:

inline_t PerformanceStats Runtime::GetScriptPerformanceStats(bool resetStats)
	{
		std::lock_guard<std::mutex> lock(m_perfMutex);
		auto end = std::chrono::high_resolution_clock::now();
		m_perfStats.perfTimeNs = std::chrono::duration_cast<std::chrono::nanoseconds>(end - m_perfStartTime).count();
		PerformanceStats s = m_perfStats;
		if (resetStats)
		{
			m_perfStats = PerformanceStats();
			m_perfStartTime = end;
		}
		return s;
	}